

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
diligent_spirv_cross::Compiler::block_is_loop_candidate
          (Compiler *this,SPIRBlock *block,Method method)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  Variant *pVVar5;
  size_t sVar6;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  SPIRBlock *pSVar10;
  SPIRBlock *pSVar11;
  SPIRBlock *pSVar12;
  SPIRBlock *to;
  long lVar13;
  byte bVar14;
  byte bVar15;
  
  if (block->disable_block_optimization != false) {
    return false;
  }
  if (block->complex_continue != false) {
    return false;
  }
  if (method != MergeToSelectContinueForLoop) {
    if (method == MergeToDirectForLoop) {
      if (*(int *)&(block->super_IVariant).field_0xc != 1) {
        return false;
      }
      if (block->merge != MergeLoop) {
        return false;
      }
      bVar7 = block_is_noop(this,block);
      if (!bVar7) {
        return false;
      }
      pSVar10 = Variant::get<diligent_spirv_cross::SPIRBlock>
                          ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                           (block->next_block).id);
      uVar9 = (ulong)(pSVar10->false_block).id;
      if ((uVar9 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
         (pVVar5 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
         pVVar5[uVar9].type == TypeBlock)) {
        pSVar11 = Variant::get<diligent_spirv_cross::SPIRBlock>(pVVar5 + uVar9);
      }
      else {
        pSVar11 = (SPIRBlock *)0x0;
      }
      uVar9 = (ulong)(pSVar10->true_block).id;
      if ((uVar9 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
         (pVVar5 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
         pVVar5[uVar9].type == TypeBlock)) {
        pSVar12 = Variant::get<diligent_spirv_cross::SPIRBlock>(pVVar5 + uVar9);
      }
      else {
        pSVar12 = (SPIRBlock *)0x0;
      }
      uVar9 = (ulong)(block->merge_block).id;
      if ((uVar9 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
         (pVVar5 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
         pVVar5[uVar9].type == TypeBlock)) {
        to = Variant::get<diligent_spirv_cross::SPIRBlock>(pVVar5 + uVar9);
      }
      else {
        to = (SPIRBlock *)0x0;
      }
      bVar7 = true;
      if ((pSVar10->false_block).id != (block->merge_block).id) {
        bVar7 = false;
        if ((pSVar11 != (SPIRBlock *)0x0) && (bVar7 = false, to != (SPIRBlock *)0x0)) {
          bVar7 = execution_is_noop(this,pSVar11,to);
        }
      }
      bVar8 = true;
      if ((pSVar10->true_block).id != (block->merge_block).id) {
        bVar8 = false;
        if ((pSVar12 != (SPIRBlock *)0x0) && (bVar8 = false, to != (SPIRBlock *)0x0)) {
          bVar8 = execution_is_noop(this,pSVar12,to);
        }
      }
      uVar1 = (pSVar10->true_block).id;
      uVar2 = (block->merge_block).id;
      uVar9 = (ulong)uVar2;
      if (uVar1 == uVar2) {
        bVar15 = 0;
      }
      else {
        bVar15 = bVar7 & uVar1 != (block->super_IVariant).self.id;
      }
      uVar1 = (pSVar10->false_block).id;
      if (uVar1 == uVar2) {
        bVar14 = 0;
      }
      else {
        bVar14 = bVar8 & uVar1 != (block->super_IVariant).self.id;
      }
      bVar7 = false;
      if ((*(int *)&(pSVar10->super_IVariant).field_0xc == 2) &&
         (bVar7 = false, pSVar10->merge == MergeNone)) {
        bVar7 = (bool)(bVar15 | bVar14);
      }
      if (bVar7 != false) {
        if ((uVar9 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
           (pVVar5 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
           pVVar5[uVar9].type == TypeBlock)) {
          pSVar11 = Variant::get<diligent_spirv_cross::SPIRBlock>(pVVar5 + uVar9);
        }
        else {
          pSVar11 = (SPIRBlock *)0x0;
        }
        if (pSVar11 != (SPIRBlock *)0x0) {
          sVar6 = (pSVar11->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.
                  buffer_size;
          if (sVar6 == 0) {
            return bVar7;
          }
          lVar13 = 0;
          while( true ) {
            uVar4 = *(uint32_t *)
                     ((long)&(((pSVar11->phi_variables).
                               super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.ptr)->parent).
                             id + lVar13);
            if (uVar4 == (block->super_IVariant).self.id) {
              return false;
            }
            if (uVar4 == (pSVar10->false_block).id) break;
            lVar13 = lVar13 + 0xc;
            if (sVar6 * 0xc == lVar13) {
              return bVar7;
            }
          }
          return false;
        }
        return bVar7;
      }
      return false;
    }
    if (method != MergeToSelectForLoop) {
      return false;
    }
  }
  uVar9 = (ulong)(block->false_block).id;
  if ((uVar9 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
     (pVVar5 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
     pVVar5[uVar9].type == TypeBlock)) {
    pSVar10 = Variant::get<diligent_spirv_cross::SPIRBlock>(pVVar5 + uVar9);
  }
  else {
    pSVar10 = (SPIRBlock *)0x0;
  }
  uVar9 = (ulong)(block->true_block).id;
  if ((uVar9 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
     (pVVar5 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
     pVVar5[uVar9].type == TypeBlock)) {
    pSVar11 = Variant::get<diligent_spirv_cross::SPIRBlock>(pVVar5 + uVar9);
  }
  else {
    pSVar11 = (SPIRBlock *)0x0;
  }
  uVar9 = (ulong)(block->merge_block).id;
  if ((uVar9 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
     (pVVar5 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
     pVVar5[uVar9].type == TypeBlock)) {
    pSVar12 = Variant::get<diligent_spirv_cross::SPIRBlock>(pVVar5 + uVar9);
  }
  else {
    pSVar12 = (SPIRBlock *)0x0;
  }
  bVar7 = true;
  if ((block->false_block).id != (block->merge_block).id) {
    bVar7 = false;
    if ((pSVar10 != (SPIRBlock *)0x0) && (bVar7 = false, pSVar12 != (SPIRBlock *)0x0)) {
      bVar7 = execution_is_noop(this,pSVar10,pSVar12);
    }
  }
  bVar8 = true;
  if ((block->true_block).id != (block->merge_block).id) {
    bVar8 = false;
    if ((pSVar11 != (SPIRBlock *)0x0) && (bVar8 = false, pSVar12 != (SPIRBlock *)0x0)) {
      bVar8 = execution_is_noop(this,pSVar11,pSVar12);
    }
  }
  uVar1 = (block->merge_block).id;
  uVar9 = (ulong)uVar1;
  uVar2 = (block->true_block).id;
  if (uVar2 == uVar1) {
    bVar15 = 0;
  }
  else {
    bVar15 = bVar7 & uVar2 != (block->super_IVariant).self.id;
  }
  uVar3 = (block->false_block).id;
  if (uVar3 == uVar1) {
    bVar14 = 0;
  }
  else {
    bVar14 = bVar8 & uVar3 != (block->super_IVariant).self.id;
  }
  bVar7 = (bool)((bVar15 | bVar14) &
                (block->merge == MergeLoop && *(int *)&(block->super_IVariant).field_0xc == 2));
  if ((bVar15 == 1 && method == MergeToSelectContinueForLoop) && (bVar7 != false)) {
    bVar7 = uVar2 == (block->continue_block).id;
  }
  else if ((method == MergeToSelectContinueForLoop & bVar14 & bVar7) == 1) {
    bVar7 = uVar3 == (block->continue_block).id;
  }
  if (bVar7 == false) {
    return false;
  }
  sVar6 = (block->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.buffer_size;
  if (sVar6 != 0) {
    lVar13 = 0;
    do {
      if (*(uint32_t *)
           ((long)&(((block->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.
                    ptr)->parent).id + lVar13) == (block->super_IVariant).self.id) {
        return false;
      }
      lVar13 = lVar13 + 0xc;
    } while (sVar6 * 0xc != lVar13);
  }
  if ((uVar9 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
     (pVVar5 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
     pVVar5[uVar9].type == TypeBlock)) {
    pSVar10 = Variant::get<diligent_spirv_cross::SPIRBlock>(pVVar5 + uVar9);
  }
  else {
    pSVar10 = (SPIRBlock *)0x0;
  }
  if (pSVar10 != (SPIRBlock *)0x0) {
    sVar6 = (pSVar10->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.
            buffer_size;
    if (sVar6 == 0) {
      return bVar7;
    }
    lVar13 = 0;
    do {
      if (*(uint32_t *)
           ((long)&(((pSVar10->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>
                    .ptr)->parent).id + lVar13) == (block->super_IVariant).self.id) {
        return false;
      }
      lVar13 = lVar13 + 0xc;
    } while (sVar6 * 0xc != lVar13);
    return bVar7;
  }
  return bVar7;
}

Assistant:

bool Compiler::block_is_loop_candidate(const SPIRBlock &block, SPIRBlock::Method method) const
{
	// Tried and failed.
	if (block.disable_block_optimization || block.complex_continue)
		return false;

	if (method == SPIRBlock::MergeToSelectForLoop || method == SPIRBlock::MergeToSelectContinueForLoop)
	{
		// Try to detect common for loop pattern
		// which the code backend can use to create cleaner code.
		// for(;;) { if (cond) { some_body; } else { break; } }
		// is the pattern we're looking for.
		const auto *false_block = maybe_get<SPIRBlock>(block.false_block);
		const auto *true_block = maybe_get<SPIRBlock>(block.true_block);
		const auto *merge_block = maybe_get<SPIRBlock>(block.merge_block);

		bool false_block_is_merge = block.false_block == block.merge_block ||
		                            (false_block && merge_block && execution_is_noop(*false_block, *merge_block));

		bool true_block_is_merge = block.true_block == block.merge_block ||
		                           (true_block && merge_block && execution_is_noop(*true_block, *merge_block));

		bool positive_candidate =
		    block.true_block != block.merge_block && block.true_block != block.self && false_block_is_merge;

		bool negative_candidate =
		    block.false_block != block.merge_block && block.false_block != block.self && true_block_is_merge;

		bool ret = block.terminator == SPIRBlock::Select && block.merge == SPIRBlock::MergeLoop &&
		           (positive_candidate || negative_candidate);

		if (ret && positive_candidate && method == SPIRBlock::MergeToSelectContinueForLoop)
			ret = block.true_block == block.continue_block;
		else if (ret && negative_candidate && method == SPIRBlock::MergeToSelectContinueForLoop)
			ret = block.false_block == block.continue_block;

		// If we have OpPhi which depends on branches which came from our own block,
		// we need to flush phi variables in else block instead of a trivial break,
		// so we cannot assume this is a for loop candidate.
		if (ret)
		{
			for (auto &phi : block.phi_variables)
				if (phi.parent == block.self)
					return false;

			auto *merge = maybe_get<SPIRBlock>(block.merge_block);
			if (merge)
				for (auto &phi : merge->phi_variables)
					if (phi.parent == block.self)
						return false;
		}
		return ret;
	}
	else if (method == SPIRBlock::MergeToDirectForLoop)
	{
		// Empty loop header that just sets up merge target
		// and branches to loop body.
		bool ret = block.terminator == SPIRBlock::Direct && block.merge == SPIRBlock::MergeLoop && block_is_noop(block);

		if (!ret)
			return false;

		auto &child = get<SPIRBlock>(block.next_block);

		const auto *false_block = maybe_get<SPIRBlock>(child.false_block);
		const auto *true_block = maybe_get<SPIRBlock>(child.true_block);
		const auto *merge_block = maybe_get<SPIRBlock>(block.merge_block);

		bool false_block_is_merge = child.false_block == block.merge_block ||
		                            (false_block && merge_block && execution_is_noop(*false_block, *merge_block));

		bool true_block_is_merge = child.true_block == block.merge_block ||
		                           (true_block && merge_block && execution_is_noop(*true_block, *merge_block));

		bool positive_candidate =
		    child.true_block != block.merge_block && child.true_block != block.self && false_block_is_merge;

		bool negative_candidate =
		    child.false_block != block.merge_block && child.false_block != block.self && true_block_is_merge;

		ret = child.terminator == SPIRBlock::Select && child.merge == SPIRBlock::MergeNone &&
		      (positive_candidate || negative_candidate);

		if (ret)
		{
			auto *merge = maybe_get<SPIRBlock>(block.merge_block);
			if (merge)
				for (auto &phi : merge->phi_variables)
					if (phi.parent == block.self || phi.parent == child.false_block)
						return false;
		}

		return ret;
	}
	else
		return false;
}